

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

void __thiscall
Scine::Core::Log::Domain::printf<char_const(&)[6],int>(Domain *this,char (*args) [6],int *args_1)

{
  int iVar1;
  char *__s;
  uint *in_RDX;
  char *in_RSI;
  char *buf;
  int sz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  Domain *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  iVar1 = snprintf((char *)0x0,0,in_RSI,(ulong)*in_RDX);
  __s = (char *)operator_new__((long)(iVar1 + 1));
  snprintf(__s,(long)(iVar1 + 1),in_RSI,(ulong)*in_RDX);
  t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0xffffffffffffffb7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  operator<<(in_stack_ffffffffffffffa0,t);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

inline void printf(Args&&... args) {
      const int sz = snprintf(NULL, 0, std::forward<Args>(args)...);
      char* buf = new char[sz + 1];
      snprintf(buf, sz + 1, std::forward<Args>(args)...);
      (*this) << std::string(buf);
      delete[] buf;
    }